

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.hpp
# Opt level: O3

void __thiscall
pstore::sparse_array<int,unsigned_int>::
sparse_array<std::_Rb_tree_const_iterator<unsigned_long>,int_const*>
          (sparse_array<int,unsigned_int> *this,_Rb_tree_const_iterator<unsigned_long> first_index,
          _Rb_tree_const_iterator<unsigned_long> last_index,int *first_value,int *last_value)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  sparse_array<int,unsigned_int> *psVar4;
  
  uVar2 = bitmap<std::_Rb_tree_const_iterator<unsigned_long>,void>(first_index,last_index);
  *(uint *)this = uVar2;
  if (first_index._M_node != last_index._M_node) {
    if (first_value != last_value) {
      iVar1 = *first_value;
      first_value = first_value + 1;
      *(int *)(this + 4) = iVar1;
    }
    first_index._M_node = (_Base_ptr)std::_Rb_tree_increment(first_index._M_node);
  }
  psVar4 = this + 8;
  if (first_value != last_value && first_index._M_node != last_index._M_node) {
    do {
      piVar3 = first_value + 1;
      *(int *)psVar4 = *first_value;
      first_index._M_node = (_Base_ptr)std::_Rb_tree_increment(first_index._M_node);
      psVar4 = psVar4 + 4;
      if (first_index._M_node == last_index._M_node) break;
      first_value = piVar3;
    } while (piVar3 != last_value);
  }
  while (first_index._M_node != last_index._M_node) {
    *(int *)psVar4 = 0;
    first_index._M_node = (_Base_ptr)std::_Rb_tree_increment(first_index._M_node);
    psVar4 = psVar4 + 4;
  }
  return;
}

Assistant:

sparse_array<ValueType, BitmapType>::sparse_array (IteratorIdx first_index,
                                                       IteratorIdx last_index,
                                                       IteratorV first_value, IteratorV last_value)
            : bitmap_{bitmap (first_index, last_index)} {

        // Deal with the first element. This is the odd-one-out becuase it's in the
        // declaration of the object and will have been default-constructed by the
        // compiler.
        if (first_index != last_index) {
            if (first_value != last_value) {
                elements_[0] = *(first_value++);
            }
            ++first_index;
        }

        auto out = &elements_[1];

        // Now construct any remaining elements into the uninitialized memory past the
        // end of the object using placement new.
        for (; first_index != last_index && first_value != last_value;
             ++first_index, ++first_value, ++out) {
            new (out) ValueType (*first_value);
        }
        // Default-construct any remaining objects for which we don't have a value.
        for (; first_index != last_index; ++first_index, ++out) {
            new (out) ValueType ();
        }
    }